

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int eval_unary_expr(lyxp_expr *exp,uint16_t *exp_idx,lyd_node *cur_node,lys_module *param_4,
                   lyxp_set *set,int options)

{
  uint8_t *puVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  char *pcVar5;
  ushort uVar6;
  uint uVar7;
  lyxp_set *set_00;
  char *pcVar8;
  bool bVar9;
  undefined1 auStack_c8 [8];
  lyxp_set set2;
  lyxp_set orig_set;
  
  uVar2 = *exp_idx;
  uVar7 = 0xffffffff;
  if (exp->used != uVar2) {
    pcVar8 = "parsed";
    if (set == (lyxp_set *)0x0) {
      pcVar8 = "skipped";
    }
    do {
      if ((exp->tokens[uVar2] != LYXP_TOKEN_OPERATOR_MATH) ||
         (exp->expr[exp->expr_pos[uVar2]] != '-')) break;
      bVar9 = uVar7 != 0xffffffff;
      uVar7 = (uint)uVar2;
      if (bVar9) {
        uVar7 = 0xffffffff;
      }
      if ('\x02' < ly_log_level) {
        pcVar5 = print_token(exp->tokens[uVar2]);
        ly_log_dbg(LY_LDGXPATH,"%-27s %s %s[%u]","eval_unary_expr",pcVar8,pcVar5,
                   (ulong)exp->expr_pos[*exp_idx]);
      }
      uVar2 = *exp_idx + 1;
      *exp_idx = uVar2;
    } while (exp->used != uVar2);
  }
  set2.ctx_pos = 0;
  set2.ctx_size = 0;
  auStack_c8 = (undefined1  [8])0x0;
  set2.type = LYXP_SET_EMPTY;
  set2._4_4_ = 0;
  set2._8_8_ = 0;
  set2.val.nodes = (lyxp_set_nodes *)0x0;
  set2.val._8_8_ = 0;
  set2.used = 0;
  set2.size = 0;
  puVar1 = exp->repeat[uVar2];
  if (puVar1 == (uint8_t *)0x0) {
    uVar3 = 0;
  }
  else {
    uVar3 = 0;
    do {
      uVar6 = uVar3;
      uVar3 = uVar6 + 1;
    } while (puVar1[(ulong)uVar6 + 1] != '\0');
    uVar3 = (ushort)puVar1[uVar6];
  }
  bVar9 = true;
  if ((uVar3 != 0) && (exp->tokens[uVar3] == LYXP_TOKEN_OPERATOR_UNI)) {
    exp_repeat_pop(exp,uVar2);
    set_fill_set((lyxp_set *)&set2.ctx_pos,set);
    bVar9 = false;
  }
  iVar4 = eval_path_expr(exp,exp_idx,cur_node,param_4,set,options);
  if (iVar4 == 0) {
    if (!bVar9) {
      pcVar8 = "parsed";
      if (set == (lyxp_set *)0x0) {
        pcVar8 = "skipped";
      }
      do {
        if ('\x02' < ly_log_level) {
          pcVar5 = print_token(exp->tokens[*exp_idx]);
          ly_log_dbg(LY_LDGXPATH,"%-27s %s %s[%u]","eval_unary_expr",pcVar8,pcVar5,
                     (ulong)exp->expr_pos[*exp_idx]);
        }
        uVar2 = *exp_idx + 1;
        *exp_idx = uVar2;
        puVar1 = exp->repeat[uVar2];
        if (puVar1 == (uint8_t *)0x0) {
          uVar3 = 0;
        }
        else {
          uVar3 = 0;
          do {
            uVar6 = uVar3;
            uVar3 = uVar6 + 1;
          } while (puVar1[(ulong)uVar6 + 1] != '\0');
          uVar3 = (ushort)puVar1[uVar6];
        }
        bVar9 = true;
        if ((uVar3 != 0) && (exp->tokens[uVar3] == LYXP_TOKEN_OPERATOR_UNI)) {
          exp_repeat_pop(exp,uVar2);
          bVar9 = false;
        }
        if (set == (lyxp_set *)0x0) {
          iVar4 = eval_path_expr(exp,exp_idx,cur_node,param_4,(lyxp_set *)0x0,options);
          if (iVar4 != 0) {
            return iVar4;
          }
        }
        else {
          set_fill_set((lyxp_set *)auStack_c8,(lyxp_set *)&set2.ctx_pos);
          iVar4 = eval_path_expr(exp,exp_idx,cur_node,param_4,(lyxp_set *)auStack_c8,options);
          if (iVar4 != 0) {
            lyxp_set_cast((lyxp_set *)&set2.ctx_pos,LYXP_SET_EMPTY,cur_node,param_4,options);
            set_00 = (lyxp_set *)auStack_c8;
            goto LAB_0016b5e8;
          }
          if ((options & 0x1cU) == 0) {
            iVar4 = moveto_union(set,(lyxp_set *)auStack_c8,cur_node,options);
            if (iVar4 != 0) {
              lyxp_set_cast((lyxp_set *)&set2.ctx_pos,LYXP_SET_EMPTY,cur_node,param_4,options);
              lyxp_set_cast((lyxp_set *)auStack_c8,LYXP_SET_EMPTY,cur_node,param_4,options);
              return -1;
            }
          }
          else {
            set_snode_merge(set,(lyxp_set *)auStack_c8);
          }
        }
      } while (!bVar9);
    }
    lyxp_set_cast((lyxp_set *)&set2.ctx_pos,LYXP_SET_EMPTY,cur_node,param_4,options);
    if (((((options & 0x1cU) == 0) && (set != (lyxp_set *)0x0)) && (-1 < (int)uVar7)) &&
       (iVar4 = moveto_op_math(set,(lyxp_set *)0x0,exp->expr + exp->expr_pos[uVar7],cur_node,param_4
                               ,options), iVar4 != 0)) {
      return -1;
    }
    iVar4 = 0;
  }
  else {
    set_00 = (lyxp_set *)&set2.ctx_pos;
LAB_0016b5e8:
    lyxp_set_cast(set_00,LYXP_SET_EMPTY,cur_node,param_4,options);
  }
  return iVar4;
}

Assistant:

static int
eval_unary_expr(struct lyxp_expr *exp, uint16_t *exp_idx, struct lyd_node *cur_node, struct lys_module *local_mod,
                struct lyxp_set *set, int options)
{
    int unary_minus, ret;
    uint16_t op_exp;
    struct lyxp_set orig_set, set2;

    /* ('-')* */
    unary_minus = -1;
    while (!exp_check_token(exp, *exp_idx, LYXP_TOKEN_OPERATOR_MATH, 0)
            && (exp->expr[exp->expr_pos[*exp_idx]] == '-')) {
        if (unary_minus == -1) {
            unary_minus = *exp_idx;
        } else {
            /* double '-' makes '+', ignore */
            unary_minus = -1;
        }
        LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
               print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
        ++(*exp_idx);
    }

    memset(&orig_set, 0, sizeof orig_set);
    memset(&set2, 0, sizeof set2);

    op_exp = exp_repeat_peek(exp, *exp_idx);
    if (op_exp && (exp->tokens[op_exp] == LYXP_TOKEN_OPERATOR_UNI)) {
        /* there is an operator */
        exp_repeat_pop(exp, *exp_idx);
        set_fill_set(&orig_set, set);
    } else {
        op_exp = 0;
    }

    /* PathExpr */
    ret = eval_path_expr(exp, exp_idx, cur_node, local_mod, set, options);
    if (ret) {
        lyxp_set_cast(&orig_set, LYXP_SET_EMPTY, cur_node, local_mod, options);
        return ret;
    }

    /* ('|' PathExpr)* */
    while (op_exp) {
        LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
               print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
        ++(*exp_idx);

        op_exp = exp_repeat_peek(exp, *exp_idx);
        if (op_exp && (exp->tokens[op_exp] == LYXP_TOKEN_OPERATOR_UNI)) {
            /* there is another operator */
            exp_repeat_pop(exp, *exp_idx);
        } else {
            op_exp = 0;
        }

        if (!set) {
            ret = eval_path_expr(exp, exp_idx, cur_node, local_mod, NULL, options);
            if (ret) {
                return ret;
            }
            continue;
        }

        set_fill_set(&set2, &orig_set);
        ret = eval_path_expr(exp, exp_idx, cur_node, local_mod, &set2, options);
        if (ret) {
            lyxp_set_cast(&orig_set, LYXP_SET_EMPTY, cur_node, local_mod, options);
            lyxp_set_cast(&set2, LYXP_SET_EMPTY, cur_node, local_mod, options);
            return ret;
        }

        /* eval */
        if (options & LYXP_SNODE_ALL) {
            set_snode_merge(set, &set2);
        } else if (moveto_union(set, &set2, cur_node, options)) {
            lyxp_set_cast(&orig_set, LYXP_SET_EMPTY, cur_node, local_mod, options);
            lyxp_set_cast(&set2, LYXP_SET_EMPTY, cur_node, local_mod, options);
            return -1;
        }
    }

    lyxp_set_cast(&orig_set, LYXP_SET_EMPTY, cur_node, local_mod, options);
    /* now we have all the unions in set and no other memory allocated */

    if (set && (unary_minus > -1) && !(options & LYXP_SNODE_ALL)) {
        if (moveto_op_math(set, NULL, &exp->expr[exp->expr_pos[unary_minus]], cur_node, local_mod, options)) {
            return -1;
        }
    }

    return EXIT_SUCCESS;
}